

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

QColor __thiscall QTextEdit::textBackgroundColor(QTextEdit *this)

{
  QColor QVar1;
  BrushStyle BVar2;
  QColor *pQVar3;
  long in_FS_OFFSET;
  QBrush *brush;
  QTextEditPrivate *d;
  QTextFormat *in_stack_ffffffffffffff98;
  QWidgetTextControl *in_stack_ffffffffffffffa8;
  QTextCursor local_38 [8];
  QBrush local_30 [24];
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTextEdit *)0x6d1875);
  QWidgetTextControl::textCursor(in_stack_ffffffffffffffa8);
  QTextCursor::charFormat();
  QTextFormat::background(in_stack_ffffffffffffff98);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6d18c7);
  QTextCursor::~QTextCursor(local_38);
  BVar2 = QBrush::style((QBrush *)0x6d18e5);
  if (BVar2 == NoBrush) {
    QColor::QColor(&local_18,transparent);
  }
  else {
    pQVar3 = QBrush::color((QBrush *)0x6d1905);
    local_18._0_8_ = *(undefined8 *)pQVar3;
    local_18._8_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
  }
  QBrush::~QBrush(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1._8_8_ = local_18._8_8_;
    QVar1._0_8_ = local_18._0_8_;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QColor QTextEdit::textBackgroundColor() const
{
    Q_D(const QTextEdit);
    const QBrush &brush = d->control->textCursor().charFormat().background();
    return brush.style() == Qt::NoBrush ? Qt::transparent : brush.color();
}